

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogFile.cpp
# Opt level: O2

void __thiscall LogFile::LogFile(LogFile *this,string *basename,int flushEveryN)

{
  MutexLock *this_00;
  AppendFile *this_01;
  string local_48;
  
  std::__cxx11::string::string((string *)this,(string *)basename);
  this->flushEveryN_ = flushEveryN;
  this->count_ = 0;
  this_00 = (MutexLock *)operator_new(0x28);
  MutexLock::MutexLock(this_00);
  (this->mutex_)._M_t.super___uniq_ptr_impl<MutexLock,_std::default_delete<MutexLock>_>._M_t.
  super__Tuple_impl<0UL,_MutexLock_*,_std::default_delete<MutexLock>_>.
  super__Head_base<0UL,_MutexLock_*,_false>._M_head_impl = this_00;
  (this->file_)._M_t.super___uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>._M_t.
  super__Tuple_impl<0UL,_AppendFile_*,_std::default_delete<AppendFile>_>.
  super__Head_base<0UL,_AppendFile_*,_false>._M_head_impl = (AppendFile *)0x0;
  this_01 = (AppendFile *)operator_new(0x10008);
  std::__cxx11::string::string((string *)&local_48,(string *)basename);
  AppendFile::AppendFile(this_01,&local_48);
  std::__uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_>::reset
            ((__uniq_ptr_impl<AppendFile,_std::default_delete<AppendFile>_> *)&this->file_,this_01);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

LogFile::LogFile(const string& basename, int flushEveryN)
    : basename_(basename),
      flushEveryN_(flushEveryN),
      count_(0),
      mutex_(new MutexLock) {
  // assert(basename.find('/') >= 0);
  file_.reset(new AppendFile(basename));
}